

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O2

void share_setup_x11_channel
               (ssh_sharing_connstate *cs,share_channel *chan,uint upstream_id,uint server_id,
               uint server_currwin,uint server_maxpkt,uint client_adjusted_window,char *peer_addr,
               int peer_port,int endian,int protomajor,int protominor,void *initial_data,
               int initial_len)

{
  BinarySink *pBVar1;
  ConnectionLayer *pCVar2;
  share_xchannel *xc;
  share_xchannel *psVar3;
  void *data;
  strbuf *psVar4;
  int greeting_len;
  
  xc = (share_xchannel *)safemalloc(1,0x20,0);
  xc->upstream_id = upstream_id;
  xc->server_id = server_id;
  xc->live = true;
  xc->msghead = (share_xchannel_message *)0x0;
  xc->msgtail = (share_xchannel_message *)0x0;
  psVar3 = (share_xchannel *)add234(cs->xchannels_by_us,xc);
  if (psVar3 == xc) {
    psVar3 = (share_xchannel *)add234(cs->xchannels_by_server,xc);
    if (psVar3 == xc) goto LAB_00135744;
    del234(cs->xchannels_by_us,xc);
  }
  safefree(xc);
  xc = (share_xchannel *)0x0;
LAB_00135744:
  data = x11_make_greeting(endian,protomajor,protominor,chan->x11_auth_proto,chan->x11_auth_data,
                           chan->x11_auth_datalen,peer_addr,peer_port,&greeting_len);
  psVar4 = strbuf_new_nm();
  pBVar1 = psVar4->binarysink_;
  BinarySink_put_uint32(pBVar1,0);
  BinarySink_put_uint32(pBVar1,(long)greeting_len + (long)initial_len);
  BinarySink_put_data(pBVar1,data,(long)greeting_len);
  BinarySink_put_data(pBVar1,initial_data,(long)initial_len);
  safefree(data);
  share_xchannel_add_message(xc,0x5e,psVar4->s,(int)psVar4->len);
  strbuf_free(psVar4);
  xc->window = client_adjusted_window + greeting_len;
  psVar4 = strbuf_new();
  pBVar1 = psVar4->binarysink_;
  BinarySink_put_stringz(pBVar1,"x11");
  BinarySink_put_uint32(pBVar1,(ulong)server_id);
  BinarySink_put_uint32(pBVar1,(ulong)server_currwin);
  BinarySink_put_uint32(pBVar1,(ulong)server_maxpkt);
  BinarySink_put_stringz(pBVar1,peer_addr);
  BinarySink_put_uint32(pBVar1,(long)peer_port);
  send_packet_to_downstream(cs,0x5a,psVar4->s,(int)psVar4->len,(share_channel *)0x0);
  strbuf_free(psVar4);
  if (chan->x11_one_shot == true) {
    pCVar2 = cs->parent->cl;
    (*pCVar2->vt->remove_sharing_x11_display)(pCVar2,chan->x11_auth_upstream);
    chan->x11_auth_upstream = (X11FakeAuth *)0x0;
    safefree(chan->x11_auth_data);
    chan->x11_auth_proto = -1;
    chan->x11_auth_datalen = 0;
    chan->x11_one_shot = false;
  }
  return;
}

Assistant:

void share_setup_x11_channel(ssh_sharing_connstate *cs, share_channel *chan,
                             unsigned upstream_id, unsigned server_id,
                             unsigned server_currwin, unsigned server_maxpkt,
                             unsigned client_adjusted_window,
                             const char *peer_addr, int peer_port, int endian,
                             int protomajor, int protominor,
                             const void *initial_data, int initial_len)
{
    struct share_xchannel *xc;
    void *greeting;
    int greeting_len;
    strbuf *packet;

    /*
     * Create an xchannel containing data we've already received from
     * the X client, and preload it with a CHANNEL_DATA message
     * containing our own made-up authorisation greeting and any
     * additional data sent from the server so far.
     */
    xc = share_add_xchannel(cs, upstream_id, server_id);
    greeting = x11_make_greeting(endian, protomajor, protominor,
                                 chan->x11_auth_proto,
                                 chan->x11_auth_data, chan->x11_auth_datalen,
                                 peer_addr, peer_port, &greeting_len);
    packet = strbuf_new_nm();
    put_uint32(packet, 0); /* leave the channel id field unfilled - we
                            * don't know the downstream id yet */
    put_uint32(packet, greeting_len + initial_len);
    put_data(packet, greeting, greeting_len);
    put_data(packet, initial_data, initial_len);
    sfree(greeting);
    share_xchannel_add_message(xc, SSH2_MSG_CHANNEL_DATA,
                               packet->s, packet->len);
    strbuf_free(packet);

    xc->window = client_adjusted_window + greeting_len;

    /*
     * Send on a CHANNEL_OPEN to downstream.
     */
    packet = strbuf_new();
    put_stringz(packet, "x11");
    put_uint32(packet, server_id);
    put_uint32(packet, server_currwin);
    put_uint32(packet, server_maxpkt);
    put_stringz(packet, peer_addr);
    put_uint32(packet, peer_port);
    send_packet_to_downstream(cs, SSH2_MSG_CHANNEL_OPEN,
                              packet->s, packet->len, NULL);
    strbuf_free(packet);

    /*
     * If this was a once-only X forwarding, clean it up now.
     */
    if (chan->x11_one_shot) {
        ssh_remove_sharing_x11_display(cs->parent->cl,
                                       chan->x11_auth_upstream);
        chan->x11_auth_upstream = NULL;
        sfree(chan->x11_auth_data);
        chan->x11_auth_proto = -1;
        chan->x11_auth_datalen = 0;
        chan->x11_one_shot = false;
    }
}